

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyImageSingleColoredRow
          (LayeredRenderCase *this,Surface *layer,float rowWidthRatio,Vec4 *barColor,bool logging)

{
  RGBA RVar1;
  int iVar2;
  int height;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  byte local_9c3;
  bool local_9c1;
  allocator<char> local_971;
  string local_970;
  allocator<char> local_949;
  string local_948;
  LogImage local_928;
  allocator<char> local_891;
  string local_890;
  allocator<char> local_869;
  string local_868;
  LogImage local_848;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  LogImageSet local_768;
  MessageBuilder local_728;
  undefined4 local_5a8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  LogImage local_558;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  LogImageSet local_478;
  MessageBuilder local_438;
  deUint32 local_2b4;
  bool local_2b0;
  Vector<bool,_3> local_2af;
  undefined1 local_2ac [4];
  bool isOk;
  RGBA local_2a0 [4];
  Vector<int,_4> local_290;
  undefined1 local_274 [12];
  Vector<int,_3> local_268;
  Vector<int,_3> local_25c;
  Vector<bool,_3> local_24d;
  undefined1 local_24a;
  bool local_249;
  undefined4 local_248;
  bool isColor;
  bool isBlack;
  int threshold;
  RGBA refColor;
  RGBA color;
  int x;
  int y;
  PixelBufferAccess local_220;
  Vector<float,_4> local_1f8;
  MessageBuilder local_1e0;
  byte local_59;
  undefined1 local_58 [7];
  bool allPixelsOk;
  Surface errorMask;
  int local_38;
  int barLengthThreshold;
  int barLength;
  bool logging_local;
  Vec4 *barColor_local;
  Surface *pSStack_20;
  float rowWidthRatio_local;
  Surface *layer_local;
  LayeredRenderCase *this_local;
  
  barLengthThreshold._3_1_ = logging;
  _barLength = barColor;
  barColor_local._4_4_ = rowWidthRatio;
  pSStack_20 = layer;
  layer_local = (Surface *)this;
  iVar2 = tcu::Surface::getWidth(layer);
  local_38 = (int)(rowWidthRatio * (float)iVar2);
  errorMask.m_pixels.m_cap._4_4_ = 1;
  iVar2 = tcu::Surface::getWidth(pSStack_20);
  height = tcu::Surface::getHeight(pSStack_20);
  tcu::Surface::Surface((Surface *)local_58,iVar2,height);
  local_59 = 1;
  if ((barLengthThreshold._3_1_ & 1) != 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1e0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1e0,
                        (char (*) [61])
                        "Expecting all pixels with distance less or equal to (about) ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_38);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [41])" pixels from left border to be of color ");
    tcu::Vector<float,_4>::swizzle(&local_1f8,(int)_barLength,0,1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(Vector<float,_3> *)&local_1f8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
  }
  tcu::Surface::getAccess(&local_220,(Surface *)local_58);
  tcu::RGBA::green();
  tcu::RGBA::toIVec((RGBA *)&y);
  tcu::clear(&local_220,(IVec4 *)&y);
  for (color.m_value = 0; iVar2 = tcu::Surface::getHeight(pSStack_20), (int)color.m_value < iVar2;
      color.m_value = color.m_value + 1) {
    for (refColor.m_value = 0; RVar1.m_value = refColor.m_value,
        iVar2 = tcu::Surface::getWidth(pSStack_20), (int)RVar1.m_value < iVar2;
        refColor.m_value = refColor.m_value + 1) {
      threshold = (int)tcu::Surface::getPixel(pSStack_20,refColor.m_value,color.m_value);
      tcu::RGBA::RGBA((RGBA *)&stack0xfffffffffffffdbc,_barLength);
      local_248 = 8;
      iVar2 = tcu::RGBA::getRed((RGBA *)&threshold);
      local_9c1 = true;
      if (8 < iVar2) {
        iVar2 = tcu::RGBA::getGreen((RGBA *)&threshold);
        local_9c1 = true;
        if (8 < iVar2) {
          iVar2 = tcu::RGBA::getBlue((RGBA *)&threshold);
          local_9c1 = iVar2 < 9;
        }
      }
      local_249 = local_9c1;
      tcu::RGBA::toIVec((RGBA *)(local_290.m_data + 3));
      tcu::Vector<int,_4>::swizzle((Vector<int,_4> *)local_274,(int)&local_290 + 0xc,0,1);
      tcu::RGBA::toIVec(local_2a0);
      tcu::Vector<int,_4>::swizzle(&local_290,(int)local_2a0,0,1);
      tcu::operator-((tcu *)&local_268,(Vector<int,_3> *)local_274,(Vector<int,_3> *)&local_290);
      tcu::abs<int,3>((tcu *)&local_25c,&local_268);
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_2ac,8,8,8);
      tcu::lessThan<int,3>((tcu *)&local_24d,&local_25c,(Vector<int,_3> *)local_2ac);
      tcu::Vector<bool,_3>::Vector(&local_2af,true,true,true);
      local_24a = tcu::allEqual<bool,3>(&local_24d,&local_2af);
      RVar1 = refColor;
      local_2b0 = (bool)local_24a;
      if (local_38 + -1 < (int)refColor.m_value) {
        local_9c3 = local_249;
        if (((int)refColor.m_value < local_38 + 1) && (local_9c3 = 1, !(bool)local_24a)) {
          local_9c3 = local_249;
        }
        local_2b0 = (bool)(local_9c3 & 1);
      }
      local_59 = (local_59 & 1 & local_2b0) != 0;
      if (local_2b0 == false) {
        local_2b4 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_58,RVar1.m_value,color.m_value,(RGBA)local_2b4);
      }
    }
  }
  if ((local_59 & 1) == 0) {
    if ((barLengthThreshold._3_1_ & 1) != 0) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_728,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_728,
                          (char (*) [50])"Image verification failed. Got unexpected pixels.");
      pTVar3 = tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_788,"LayerContent",&local_789);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b0,"Layer content",&local_7b1);
      tcu::LogImageSet::LogImageSet(&local_768,&local_788,&local_7b0);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_768);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"Layer",&local_869);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"Layer",&local_891);
      tcu::LogImage::LogImage
                (&local_848,&local_868,&local_890,pSStack_20,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_848);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_948,"ErrorMask",&local_949);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_970,"Errors",&local_971);
      tcu::LogImage::LogImage
                (&local_928,&local_948,&local_970,(Surface *)local_58,QP_IMAGE_COMPRESSION_MODE_BEST
                );
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_928);
      tcu::TestLog::operator<<(pTVar3,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_928);
      std::__cxx11::string::~string((string *)&local_970);
      std::allocator<char>::~allocator(&local_971);
      std::__cxx11::string::~string((string *)&local_948);
      std::allocator<char>::~allocator(&local_949);
      tcu::LogImage::~LogImage(&local_848);
      std::__cxx11::string::~string((string *)&local_890);
      std::allocator<char>::~allocator(&local_891);
      std::__cxx11::string::~string((string *)&local_868);
      std::allocator<char>::~allocator(&local_869);
      tcu::LogImageSet::~LogImageSet(&local_768);
      std::__cxx11::string::~string((string *)&local_7b0);
      std::allocator<char>::~allocator(&local_7b1);
      std::__cxx11::string::~string((string *)&local_788);
      std::allocator<char>::~allocator(&local_789);
      tcu::MessageBuilder::~MessageBuilder(&local_728);
    }
    this_local._7_1_ = 0;
  }
  else {
    if ((barLengthThreshold._3_1_ & 1) != 0) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_438,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_438,(char (*) [16])"Image is valid.");
      pTVar3 = tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_498,"LayerContent",&local_499);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"Layer content",&local_4c1);
      tcu::LogImageSet::LogImageSet(&local_478,&local_498,&local_4c0);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_478);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"Layer",&local_579);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"Layer",&local_5a1);
      tcu::LogImage::LogImage
                (&local_558,&local_578,&local_5a0,pSStack_20,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_558);
      tcu::TestLog::operator<<(pTVar3,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_558);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::allocator<char>::~allocator(&local_5a1);
      std::__cxx11::string::~string((string *)&local_578);
      std::allocator<char>::~allocator(&local_579);
      tcu::LogImageSet::~LogImageSet(&local_478);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator(&local_499);
      tcu::MessageBuilder::~MessageBuilder(&local_438);
    }
    this_local._7_1_ = 1;
  }
  local_5a8 = 1;
  tcu::Surface::~Surface((Surface *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LayeredRenderCase::verifyImageSingleColoredRow (const tcu::Surface& layer, float rowWidthRatio, const tcu::Vec4& barColor, bool logging)
{
	DE_ASSERT(rowWidthRatio > 0.0f);

	const int		barLength			= (int)(rowWidthRatio * (float)layer.getWidth());
	const int		barLengthThreshold	= 1;
	tcu::Surface	errorMask			(layer.getWidth(), layer.getHeight());
	bool			allPixelsOk			= true;

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Expecting all pixels with distance less or equal to (about) " << barLength << " pixels from left border to be of color " << barColor.swizzle(0,1,2) << "." << tcu::TestLog::EndMessage;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toIVec());

	for (int y = 0; y < layer.getHeight(); ++y)
	for (int x = 0; x < layer.getWidth(); ++x)
	{
		const tcu::RGBA color		= layer.getPixel(x, y);
		const tcu::RGBA refColor	= tcu::RGBA(barColor);
		const int		threshold	= 8;
		const bool		isBlack		= color.getRed() <= threshold || color.getGreen() <= threshold || color.getBlue() <= threshold;
		const bool		isColor		= tcu::allEqual(tcu::lessThan(tcu::abs(color.toIVec().swizzle(0, 1, 2) - refColor.toIVec().swizzle(0, 1, 2)), tcu::IVec3(threshold, threshold, threshold)), tcu::BVec3(true, true, true));

		bool			isOk;

		if (x <= barLength - barLengthThreshold)
			isOk = isColor;
		else if (x >= barLength + barLengthThreshold)
			isOk = isBlack;
		else
			isOk = isColor || isBlack;

		allPixelsOk &= isOk;

		if (!isOk)
			errorMask.setPixel(x, y, tcu::RGBA::red());
	}

	if (allPixelsOk)
	{
		if (logging)
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Image is valid." << tcu::TestLog::EndMessage
								<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
								<< tcu::TestLog::Image("Layer", "Layer", layer)
								<< tcu::TestLog::EndImageSet;
		return true;
	}
	else
	{
		if (logging)
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Image verification failed. Got unexpected pixels." << tcu::TestLog::EndMessage
								<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
								<< tcu::TestLog::Image("Layer",		"Layer",	layer)
								<< tcu::TestLog::Image("ErrorMask",	"Errors",	errorMask)
								<< tcu::TestLog::EndImageSet;
		return false;
	}

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Image("LayerContent", "Layer content", layer);

	return allPixelsOk;
}